

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  byte *pbVar1;
  ENetList *pEVar2;
  ENetList *pEVar3;
  undefined8 *puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  short sVar8;
  short sVar9;
  enet_uint32 eVar10;
  uint uVar11;
  enet_uint32 eVar12;
  ENetPeer *peer;
  _func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *p_Var13;
  ENetChecksumCallback p_Var14;
  size_t sVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  _ENetListNode *p_Var19;
  _ENetListNode *p_Var20;
  ushort uVar21;
  int iVar22;
  size_t sVar23;
  void *pvVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  undefined8 *puVar28;
  uint uVar29;
  ulong uVar30;
  _ENetListNode *p_Var31;
  ENetListIterator pEVar32;
  ulong uVar33;
  enet_uint32 eVar34;
  ENetPacket *pEVar35;
  ENetListIterator position;
  _ENetListNode *p_Var36;
  long lVar37;
  long local_a0;
  enet_uint8 headerData [10];
  long local_68;
  
  host->continueSending = 1;
  iVar22 = 1;
  do {
    if (iVar22 == 0) {
      return 0;
    }
    host->continueSending = 0;
    for (uVar33 = 0; uVar33 < host->peerCount; uVar33 = uVar33 + 1) {
      peer = host->peer_list[uVar33];
      if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE))
      {
        host->headerFlags = 0;
        host->commandCount = 0;
        host->bufferCount = 1;
        host->packetSize = 6;
        p_Var31 = (peer->acknowledgements).sentinel.next;
        if (p_Var31 != &(peer->acknowledgements).sentinel) {
          lVar37 = 0x6c8;
          uVar30 = 0x6c;
          while (p_Var31 != &(peer->acknowledgements).sentinel) {
            if (0x6ab < uVar30) {
              uVar30 = 0x6ac;
              lVar37 = 0x8c8;
LAB_0010506e:
              host->continueSending = 1;
              break;
            }
            sVar23 = host->packetSize;
            if (peer->mtu - sVar23 < 8) goto LAB_0010506e;
            p_Var36 = p_Var31->next;
            *(ulong *)((long)host->commands + lVar37 + -0x6c) =
                 (long)host->commands + (uVar30 - 0x6c);
            *(undefined8 *)((long)host->commands + lVar37 + -100) = 8;
            host->packetSize = sVar23 + 8;
            uVar21 = *(ushort *)((long)&p_Var31[1].next + 6);
            uVar21 = uVar21 << 8 | uVar21 >> 8;
            *(undefined1 *)((long)host->commands + (uVar30 - 0x6c)) = 1;
            *(undefined1 *)((long)host->commands + (uVar30 - 0x6b)) =
                 *(undefined1 *)((long)&p_Var31[1].next + 5);
            *(ushort *)((long)host->commands + (uVar30 - 0x6a)) = uVar21;
            *(ushort *)((long)host->commands + (uVar30 - 0x68)) = uVar21;
            *(ushort *)((long)host->commands + (uVar30 - 0x66)) =
                 *(ushort *)&p_Var31[1].next << 8 | *(ushort *)&p_Var31[1].next >> 8;
            if (((ulong)p_Var31[1].next & 0xf00000000) == 0x400000000) {
              enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
            }
            enet_list_remove(p_Var31);
            enet_free(p_Var31);
            uVar30 = uVar30 + 0x32;
            lVar37 = lVar37 + 0x10;
            p_Var31 = p_Var36;
          }
          uVar29 = (int)uVar30 - 0x6c;
          host->commandCount =
               (long)(short)((int)((uint)(ushort)((short)uVar29 >> 0xf) << 0x10 | uVar29 & 0xffff) /
                            0x32);
          host->bufferCount = lVar37 + -0x6b8 >> 4;
        }
        if (checkForTimeouts != 0) {
          pEVar2 = &peer->sentReliableCommands;
          p_Var31 = (peer->sentReliableCommands).sentinel.next;
          if ((p_Var31 != &pEVar2->sentinel) && (host->serviceTime - peer->nextTimeout < 86400000))
          {
            pEVar32 = (peer->outgoingReliableCommands).sentinel.next;
            while (position = p_Var31, position != &pEVar2->sentinel) {
              p_Var31 = position->next;
              eVar34 = host->serviceTime;
              eVar10 = *(enet_uint32 *)((long)&position[1].next + 4);
              uVar26 = eVar34 - eVar10;
              uVar25 = eVar10 - eVar34;
              uVar29 = uVar26;
              if (86399999 < uVar26) {
                uVar29 = uVar25;
              }
              uVar11 = *(uint *)&position[1].previous;
              if (uVar11 <= uVar29) {
                eVar12 = peer->earliestTimeout;
                if ((eVar12 == 0) || (86399999 < eVar10 - eVar12)) {
                  peer->earliestTimeout = eVar10;
                  if (eVar10 != 0) goto LAB_001054b0;
                }
                else {
                  uVar26 = eVar34 - eVar12;
                  uVar25 = eVar12 - eVar34;
LAB_001054b0:
                  if (uVar26 < 86400000) {
                    uVar25 = uVar26;
                  }
                  if ((peer->timeoutMaximum <= uVar25) ||
                     ((*(uint *)((long)&position[1].previous + 4) <= uVar11 &&
                      (peer->timeoutMinimum <= uVar25)))) {
                    enet_protocol_notify_disconnect(host,peer,event);
                    if ((event != (ENetEvent *)0x0) && (event->type != ENET_EVENT_TYPE_NONE)) {
                      return 1;
                    }
                    goto LAB_00105726;
                  }
                }
                if (position[6].next != (_ENetListNode *)0x0) {
                  peer->reliableDataInTransit =
                       peer->reliableDataInTransit - (uint)*(ushort *)((long)&position[2].next + 4);
                }
                peer->packetsLost = peer->packetsLost + 1;
                *(uint *)&position[1].previous = uVar11 * 2;
                pvVar24 = enet_list_remove(position);
                enet_list_insert(pEVar32,pvVar24);
                p_Var36 = (peer->sentReliableCommands).sentinel.next;
                if (p_Var36 != &pEVar2->sentinel && p_Var31 == p_Var36) {
                  peer->nextTimeout =
                       *(int *)&p_Var31[1].previous + *(int *)((long)&p_Var31[1].next + 4);
                }
              }
            }
          }
        }
        pEVar2 = &peer->outgoingReliableCommands;
        if ((((peer->outgoingReliableCommands).sentinel.next == &pEVar2->sentinel) ||
            (iVar22 = enet_protocol_send_reliable_outgoing_commands(host,peer), iVar22 != 0)) &&
           ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) {
          uVar25 = host->serviceTime - peer->lastReceiveTime;
          uVar29 = peer->lastReceiveTime - host->serviceTime;
          if (uVar25 < 86400000) {
            uVar29 = uVar25;
          }
          if ((peer->pingInterval <= uVar29) && (3 < (ulong)peer->mtu - host->packetSize)) {
            enet_peer_ping(peer);
            enet_protocol_send_reliable_outgoing_commands(host,peer);
          }
        }
        pEVar3 = &peer->outgoingUnreliableCommands;
        p_Var31 = (peer->outgoingUnreliableCommands).sentinel.next;
        sVar23 = host->commandCount;
        if (p_Var31 != &pEVar3->sentinel) {
          local_a0 = sVar23 * 0x32 + 0x6c;
          lVar37 = host->bufferCount * 0x10 + 0x6b8;
          while (p_Var31 != &pEVar3->sentinel) {
            if ((0x6ab < local_a0) || (0xab7 < lVar37)) {
LAB_00105359:
              host->continueSending = 1;
              break;
            }
            uVar30 = commandSizes[*(byte *)&p_Var31[2].previous & 0xf];
            sVar23 = host->packetSize;
            uVar27 = peer->mtu - sVar23;
            if (uVar27 < uVar30) goto LAB_00105359;
            pEVar35 = (ENetPacket *)p_Var31[6].next;
            if (pEVar35 == (ENetPacket *)0x0) {
              p_Var36 = p_Var31->next;
LAB_001052cf:
              local_68 = lVar37 + 0x10;
              puVar28 = (undefined8 *)((long)host->commands + local_a0 + -0x6c);
              puVar4 = (undefined8 *)((long)host->commands + lVar37 + -0x6c);
              *puVar4 = puVar28;
              puVar4[1] = uVar30;
              host->packetSize = sVar23 + uVar30;
              *(undefined2 *)(puVar28 + 6) = *(undefined2 *)&p_Var31[5].previous;
              p_Var19 = p_Var31[2].previous;
              p_Var20 = p_Var31[3].next;
              auVar7 = *(undefined1 (*) [16])&p_Var31[3].previous;
              uVar16 = *(undefined4 *)((long)&p_Var31[4].previous + 4);
              uVar17 = *(undefined4 *)&p_Var31[5].next;
              uVar18 = *(undefined4 *)((long)&p_Var31[5].next + 4);
              *(undefined4 *)(puVar28 + 4) = *(undefined4 *)&p_Var31[4].previous;
              *(undefined4 *)((long)puVar28 + 0x24) = uVar16;
              *(undefined4 *)(puVar28 + 5) = uVar17;
              *(undefined4 *)((long)puVar28 + 0x2c) = uVar18;
              *(undefined1 (*) [16])(puVar28 + 2) = auVar7;
              *puVar28 = p_Var19;
              puVar28[1] = p_Var20;
              enet_list_remove(p_Var31);
              if (p_Var31[6].next == (_ENetListNode *)0x0) {
                enet_free(p_Var31);
              }
              else {
                *(ulong *)((long)host->commands + lVar37 + -0x5c) =
                     (long)&(p_Var31[6].next[1].next)->next + (ulong)*(uint *)&p_Var31[2].next;
                uVar30 = (ulong)*(ushort *)((long)&p_Var31[2].next + 4);
                puVar4[3] = uVar30;
                host->packetSize = host->packetSize + uVar30;
                enet_list_insert(&(peer->sentUnreliableCommands).sentinel,p_Var31);
                local_68 = lVar37 + 0x20;
              }
              local_a0 = local_a0 + 0x32;
              p_Var31 = p_Var36;
              lVar37 = local_68;
            }
            else {
              if (uVar27 < *(ushort *)((long)&p_Var31[2].next + 4) + uVar30) goto LAB_00105359;
              p_Var36 = p_Var31->next;
              if ((*(int *)&p_Var31[2].next != 0) ||
                 (uVar29 = peer->packetThrottleCounter + 7 & 0x1f,
                 peer->packetThrottleCounter = uVar29, uVar29 <= peer->packetThrottle))
              goto LAB_001052cf;
              sVar8 = *(short *)&p_Var31[1].next;
              sVar9 = *(short *)((long)&p_Var31[1].next + 2);
              pEVar32 = p_Var31;
              p_Var31 = p_Var36;
              while( true ) {
                pEVar35->referenceCount = pEVar35->referenceCount - 1;
                if (pEVar35->referenceCount == 0) {
                  enet_packet_destroy(pEVar35);
                }
                enet_list_remove(pEVar32);
                enet_free(pEVar32);
                if (((p_Var31 == &pEVar3->sentinel) || (*(short *)&p_Var31[1].next != sVar8)) ||
                   (*(short *)((long)&p_Var31[1].next + 2) != sVar9)) break;
                pEVar35 = (ENetPacket *)p_Var31[6].next;
                pEVar32 = p_Var31;
                p_Var31 = p_Var31->next;
              }
            }
          }
          sVar23 = (local_a0 + -0x6c) / 0x32;
          host->commandCount = sVar23;
          host->bufferCount = lVar37 + -0x6b8 >> 4;
          if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
              ((pEVar2->sentinel).next == &pEVar2->sentinel)) &&
             (((pEVar3->sentinel).next == &pEVar3->sentinel &&
              ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)
              ))) {
            enet_peer_disconnect(peer,peer->eventData);
            sVar23 = host->commandCount;
          }
        }
        if (sVar23 != 0) {
          eVar34 = peer->packetLossEpoch;
          eVar10 = host->serviceTime;
          if (eVar34 == 0) {
            peer->packetLossEpoch = eVar10;
          }
          else {
            uVar29 = eVar34 - eVar10;
            if (eVar10 - eVar34 < 86400000) {
              uVar29 = eVar10 - eVar34;
            }
            if ((9999 < uVar29) && (peer->packetsSent != 0)) {
              uVar29 = peer->packetLoss;
              uVar25 = (peer->packetsLost << 0x10) / peer->packetsSent;
              if (uVar25 < uVar29) {
                eVar34 = uVar29 - (uVar29 - uVar25 >> 3);
                uVar25 = eVar34 - uVar25;
              }
              else {
                eVar34 = (uVar25 - uVar29 >> 3) + uVar29;
                uVar25 = uVar25 - eVar34;
              }
              peer->packetLoss = eVar34;
              peer->packetLossVariance =
                   (uVar25 >> 2) + (peer->packetLossVariance - (peer->packetLossVariance >> 2));
              peer->packetLossEpoch = eVar10;
              peer->packetsSent = 0;
              peer->packetsLost = 0;
            }
          }
          host->buffers[0].data = headerData;
          uVar29 = host->headerFlags;
          sVar23 = 4;
          if ((uVar29 >> 0x1b & 1) != 0) {
            headerData._4_2_ = (ushort)eVar10 << 8 | (ushort)eVar10 >> 8;
            sVar23 = 6;
          }
          host->buffers[0].dataLength = sVar23;
          pvVar24 = (host->compressor).context;
          if ((pvVar24 == (void *)0x0) ||
             (p_Var13 = (host->compressor).compress,
             p_Var13 ==
             (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0)) {
LAB_00105612:
            sVar23 = 0;
          }
          else {
            uVar30 = host->packetSize - 6;
            sVar23 = (*p_Var13)(pvVar24,host->buffers + 1,host->bufferCount - 1,uVar30,
                                host->packetData[1],uVar30);
            uVar29 = host->headerFlags;
            if (uVar30 <= sVar23 || sVar23 == 0) goto LAB_00105612;
            uVar29 = uVar29 | 0x4000000;
            host->headerFlags = uVar29;
          }
          uVar25 = peer->outgoingPeerID;
          if (uVar25 < 0xffffff) {
            iVar22._0_1_ = peer->outgoingSessionID;
            iVar22._1_1_ = peer->incomingSessionID;
            iVar22._2_2_ = *(undefined2 *)&peer->field_0x26;
            uVar29 = uVar29 | iVar22 << 0x18;
            host->headerFlags = uVar29;
          }
          uVar29 = uVar29 | uVar25;
          headerData._0_4_ =
               uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 | uVar29 << 0x18;
          p_Var14 = host->checksum;
          if (p_Var14 != (ENetChecksumCallback)0x0) {
            eVar34 = 0;
            if (uVar25 < 0xffffff) {
              eVar34 = peer->connectID;
            }
            sVar15 = host->buffers[0].dataLength;
            *(enet_uint32 *)(headerData + sVar15) = eVar34;
            host->buffers[0].dataLength = sVar15 + 4;
            eVar34 = (*p_Var14)(host->buffers,host->bufferCount);
            *(enet_uint32 *)(headerData + sVar15) = eVar34;
          }
          if (sVar23 == 0) {
            sVar23 = host->bufferCount;
          }
          else {
            host->buffers[1].data = host->packetData + 1;
            host->buffers[1].dataLength = sVar23;
            host->bufferCount = 2;
            sVar23 = 2;
          }
          peer->lastSendTime = host->serviceTime;
          iVar22 = enet_socket_send(host->socket,&peer->address,host->buffers,sVar23);
          while (pEVar32 = (peer->sentUnreliableCommands).sentinel.next,
                pEVar32 != &(peer->sentUnreliableCommands).sentinel) {
            enet_list_remove(pEVar32);
            pEVar35 = (ENetPacket *)pEVar32[6].next;
            if ((pEVar35 != (ENetPacket *)0x0) &&
               (pEVar35->referenceCount = pEVar35->referenceCount - 1, pEVar35->referenceCount == 0)
               ) {
              pbVar1 = (byte *)((long)&pEVar35->flags + 1);
              *pbVar1 = *pbVar1 | 1;
              enet_packet_destroy(pEVar35);
            }
            enet_free(pEVar32);
          }
          if (iVar22 < 0) {
            return -1;
          }
          uVar5 = host->totalSentData;
          uVar6 = host->totalSentPackets;
          host->totalSentData = iVar22 + uVar5;
          host->totalSentPackets = uVar6 + 1;
        }
      }
LAB_00105726:
    }
    iVar22 = host->continueSending;
  } while( true );
}

Assistant:

static int
enet_protocol_send_outgoing_commands (ENetHost * host, ENetEvent * event, int checkForTimeouts)
{
    enet_uint8 headerData [sizeof (ENetProtocolHeader) + sizeof (enet_uint32)];
    ENetProtocolHeader * header = (ENetProtocolHeader *) headerData;
    ENetPeer * currentPeer;
    int sentLength;
    size_t shouldCompress = 0;
    int i;

    host -> continueSending = 1;

    while (host -> continueSending)
    for (host -> continueSending = 0,
	     i = 0; i < host -> peerCount; i++ )
    {
	currentPeer = host -> peer_list[i];
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED ||
            currentPeer -> state == ENET_PEER_STATE_ZOMBIE)
          continue;

        host -> headerFlags = 0;
        host -> commandCount = 0;
        host -> bufferCount = 1;
        host -> packetSize = sizeof (ENetProtocolHeader);

        if (! enet_list_empty (& currentPeer -> acknowledgements))
          enet_protocol_send_acknowledgements (host, currentPeer);

        if (checkForTimeouts != 0 &&
            ! enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_GREATER_EQUAL (host -> serviceTime, currentPeer -> nextTimeout) &&
            enet_protocol_check_timeouts (host, currentPeer, event) == 1)
        {
            if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
              return 1;
            else
              continue;
        }

        if ((enet_list_empty (& currentPeer -> outgoingReliableCommands) ||
              enet_protocol_send_reliable_outgoing_commands (host, currentPeer)) &&
            enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> lastReceiveTime) >= currentPeer -> pingInterval &&
            currentPeer -> mtu - host -> packetSize >= sizeof (ENetProtocolPing))
        { 
            enet_peer_ping (currentPeer);
            enet_protocol_send_reliable_outgoing_commands (host, currentPeer);
        }
                      
        if (! enet_list_empty (& currentPeer -> outgoingUnreliableCommands))
          enet_protocol_send_unreliable_outgoing_commands (host, currentPeer);

        if (host -> commandCount == 0)
          continue;

        if (currentPeer -> packetLossEpoch == 0)
          currentPeer -> packetLossEpoch = host -> serviceTime;
        else
        if (ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> packetLossEpoch) >= ENET_PEER_PACKET_LOSS_INTERVAL &&
            currentPeer -> packetsSent > 0)
        {
           enet_uint32 packetLoss = currentPeer -> packetsLost * ENET_PEER_PACKET_LOSS_SCALE / currentPeer -> packetsSent;

#ifdef ENET_DEBUG
           printf ("peer %u: %f%%+-%f%% packet loss, %u+-%u ms round trip time, %f%% throttle, %u/%u outgoing, %u/%u incoming\n", currentPeer -> incomingPeerID, currentPeer -> packetLoss / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> packetLossVariance / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> roundTripTime, currentPeer -> roundTripTimeVariance, currentPeer -> packetThrottle / (float) ENET_PEER_PACKET_THROTTLE_SCALE, enet_list_size (& currentPeer -> outgoingReliableCommands), enet_list_size (& currentPeer -> outgoingUnreliableCommands), currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingReliableCommands) : 0, currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingUnreliableCommands) : 0);
#endif
          
           currentPeer -> packetLossVariance -= currentPeer -> packetLossVariance / 4;

           if (packetLoss >= currentPeer -> packetLoss)
           {
              currentPeer -> packetLoss += (packetLoss - currentPeer -> packetLoss) / 8;
              currentPeer -> packetLossVariance += (packetLoss - currentPeer -> packetLoss) / 4;
           }
           else
           {
              currentPeer -> packetLoss -= (currentPeer -> packetLoss - packetLoss) / 8;
              currentPeer -> packetLossVariance += (currentPeer -> packetLoss - packetLoss) / 4;
           }

           currentPeer -> packetLossEpoch = host -> serviceTime;
           currentPeer -> packetsSent = 0;
           currentPeer -> packetsLost = 0;
        }

        host -> buffers -> data = headerData;
        if (host -> headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME)
        {
            header -> sentTime = ENET_HOST_TO_NET_16 (host -> serviceTime & 0xFFFF);

            host -> buffers -> dataLength = sizeof (ENetProtocolHeader);
        }
        else
          host -> buffers -> dataLength = (size_t) & ((ENetProtocolHeader *) 0) -> sentTime;

        shouldCompress = 0;
        if (host -> compressor.context != NULL && host -> compressor.compress != NULL)
        {
            size_t originalSize = host -> packetSize - sizeof(ENetProtocolHeader),
                   compressedSize = host -> compressor.compress (host -> compressor.context,
                                        & host -> buffers [1], host -> bufferCount - 1,
                                        originalSize,
                                        host -> packetData [1],
                                        originalSize);
            if (compressedSize > 0 && compressedSize < originalSize)
            {
                host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_COMPRESSED;
                shouldCompress = compressedSize;
#ifdef ENET_DEBUG_COMPRESS
                printf ("peer %u: compressed %u -> %u (%u%%)\n", currentPeer -> incomingPeerID, originalSize, compressedSize, (compressedSize * 100) / originalSize);
#endif
            }
        }

        if (currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
          host -> headerFlags |= currentPeer -> outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;
        header -> peerID = ENET_HOST_TO_NET_32 (currentPeer -> outgoingPeerID | host -> headerFlags);
        if (host -> checksum != NULL)
        {
            enet_uint32 * checksum = (enet_uint32 *) & headerData [host -> buffers -> dataLength];
            * checksum = currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer -> connectID : 0;
            host -> buffers -> dataLength += sizeof (enet_uint32);
            * checksum = host -> checksum (host -> buffers, host -> bufferCount);
        }

        if (shouldCompress > 0)
        {
            host -> buffers [1].data = host -> packetData [1];
            host -> buffers [1].dataLength = shouldCompress;
            host -> bufferCount = 2;
        }

        currentPeer -> lastSendTime = host -> serviceTime;

        sentLength = enet_socket_send (host -> socket, & currentPeer -> address, host -> buffers, host -> bufferCount);

        enet_protocol_remove_sent_unreliable_commands (currentPeer);

        if (sentLength < 0)
          return -1;

        host -> totalSentData += sentLength;
        host -> totalSentPackets ++;
    }
   
    return 0;
}